

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::problem>::preprocessor
          (preprocessor<baryonyx::problem> *this,context *ctx_,problem *pb_)

{
  vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
  *this_00;
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pfVar4;
  long lVar5;
  function_element *elem;
  pointer pfVar6;
  function_element *elem_2;
  allocator_type local_67;
  allocator_type local_66;
  allocator_type local_65;
  int i_2;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  pp_lifo *local_40;
  to_merge_with_objective_function *local_38;
  
  this->ctx = ctx_;
  this->pb = pb_;
  (this->vars)._M_h._M_buckets = &(this->vars)._M_h._M_single_bucket;
  (this->vars)._M_h._M_bucket_count = 1;
  (this->vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars)._M_h._M_element_count = 0;
  (this->vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->equal_constraints,
             ((long)(pb_->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pb_->equal_constraints).
                   super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,&local_65);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->greater_constraints,
             ((long)(this->pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->pb->greater_constraints).
                   super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,&local_66);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->less_constraints,
             ((long)(this->pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->pb->less_constraints).
                   super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,&local_67);
  this_00 = &this->cache;
  lVar5 = (long)(this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58 = &this->less_constraints;
  local_50 = &this->greater_constraints;
  local_48 = &this->equal_constraints;
  std::
  vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
  ::vector(this_00,lVar5 / 0xc,(allocator_type *)(lVar5 % 0xc));
  local_38 = &this->merge_obj;
  (this->merge_obj).value = 0.0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lifo).data.
  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->merge_obj).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->merge_obj).value = 0.0;
  i = 0;
  local_40 = &this->lifo;
  pcVar1 = (this->pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->pb->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; i != (int)(((long)pcVar1 - (long)pcVar2) / 0x30); i = i + 1) {
    pcVar3 = (this->pb->equal_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pfVar4 = *(pointer *)
              ((long)&pcVar3[i].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    for (pfVar6 = pcVar3[i].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl.super__Vector_impl_data._M_start; pfVar6 != pfVar4; pfVar6 = pfVar6 + 1)
    {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)
                 ((this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start + pfVar6->variable_index),&i);
    }
  }
  i_1 = 0;
  pcVar1 = (this->pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->pb->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; i_1 != (int)(((long)pcVar1 - (long)pcVar2) / 0x30); i_1 = i_1 + 1) {
    pcVar3 = (this->pb->greater_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pfVar4 = *(pointer *)
              ((long)&pcVar3[i_1].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    for (pfVar6 = pcVar3[i_1].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl.super__Vector_impl_data._M_start; pfVar6 != pfVar4; pfVar6 = pfVar6 + 1)
    {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)
                 &(this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start[pfVar6->variable_index].
                  in_greater_constraints,&i_1);
    }
  }
  i_2 = 0;
  pcVar1 = (this->pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->pb->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; i_2 != (int)(((long)pcVar1 - (long)pcVar2) / 0x30); i_2 = i_2 + 1) {
    pcVar3 = (this->pb->less_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pfVar4 = *(pointer *)
              ((long)&pcVar3[i_2].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    for (pfVar6 = pcVar3[i_2].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl.super__Vector_impl_data._M_start; pfVar6 != pfVar4; pfVar6 = pfVar6 + 1)
    {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)
                 &(this_00->
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  )._M_impl.super__Vector_impl_data._M_start[pfVar6->variable_index].
                  in_less_constraints,&i_2);
    }
  }
  return;
}

Assistant:

explicit preprocessor(const bx::context& ctx_, const Problem& pb_)
      : ctx(ctx_)
      , pb(pb_)
      , equal_constraints(pb.equal_constraints.size())
      , greater_constraints(pb.greater_constraints.size())
      , less_constraints(pb.less_constraints.size())
      , cache(pb.vars.values.size())
    {
        // The cache stores for each variable, all constraint where element
        // variable is used.

        for (int i = 0, e = bx::length(pb.equal_constraints); i != e; ++i)
            for (const auto& elem : pb.equal_constraints[i].elements)
                cache[elem.variable_index].in_equal_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.greater_constraints); i != e; ++i)
            for (const auto& elem : pb.greater_constraints[i].elements)
                cache[elem.variable_index].in_greater_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.less_constraints); i != e; ++i)
            for (const auto& elem : pb.less_constraints[i].elements)
                cache[elem.variable_index].in_less_constraints.emplace_back(i);
    }